

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScsServer.cpp
# Opt level: O3

void __thiscall Scs::Server::~Server(Server *this)

{
  ~Server(this);
  operator_delete(this,0x198);
  return;
}

Assistant:

Server::~Server()
{
	LogWriteLine("Shutting down server.");
    m_shutDown = true;
	if (m_thread.joinable())
		m_thread.join();
}